

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,undefined8 *state,long *next)

{
  undefined1 uVar1;
  undefined8 uVar2;
  char cVar3;
  
  uVar2 = *state;
  if (this[8] ==
      (lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
       )0x1) {
    uVar1 = *(undefined1 *)((long)state + 0x31);
    cVar3 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    if (cVar3 != '\0') {
      *state = uVar2;
      *(undefined1 *)((long)state + 0x31) = uVar1;
      return false;
    }
    cVar3 = (**(code **)(*next + 0x10))(next,state);
    *(undefined1 *)((long)state + 0x31) = uVar1;
  }
  else {
    cVar3 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    if (cVar3 == '\0') {
      return false;
    }
    *state = uVar2;
    cVar3 = (**(code **)(*next + 0x10))(next,state);
  }
  if (cVar3 == '\0') {
    return false;
  }
  return true;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::true_) const
        {
            BidiIter const tmp = state.cur_;

            if(this->not_)
            {
                // negative look-ahead assertions do not trigger partial matches.
                save_restore<bool> partial_match(state.found_partial_match_);
                detail::ignore_unused(partial_match);

                if(this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
                else if(next.match(state))
                {
                    return true;
                }
            }
            else
            {
                if(!this->xpr_.match(state))
                {
                    return false;
                }
                state.cur_ = tmp;
                if(next.match(state))
                {
                    return true;
                }
            }

            BOOST_ASSERT(state.cur_ == tmp);
            return false;
        }